

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

int parsedate(char *date,time_t *output)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  int i;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  char **what;
  char **ppcVar14;
  long lVar15;
  bool bVar16;
  int local_90;
  int local_8c;
  int local_88;
  uint local_84;
  int local_80;
  int len;
  int minnum;
  int hournum;
  int local_70;
  uint local_6c;
  char buf [32];
  
  hournum = -1;
  minnum = -1;
  local_88 = -1;
  local_90 = -1;
  local_84 = 0;
  local_6c = 0;
  uVar8 = 0xffffffff;
  lVar13 = 0xffffffff;
  pbVar10 = (byte *)date;
  local_8c = local_90;
  local_80 = local_90;
  do {
    bVar3 = *pbVar10;
    if ((bVar3 == 0) || (5 < local_6c)) {
      if (local_88 == -1) {
        hournum = 0;
        minnum = 0;
        local_88 = 0;
      }
      iVar4 = -1;
      if ((((local_80 != -1) && (uVar8 != 0xffffffff)) && (0x62e < local_8c)) &&
         ((local_88 < 0x3d && minnum < 0x3c) &&
          (hournum < 0x18 && ((int)uVar8 < 0xc && local_80 < 0x20)))) {
        uVar9 = uVar8;
        if ((int)uVar8 < 0) {
          local_8c = local_8c + (0xb - uVar8) / 0xc;
          uVar9 = 0xb - (0xb - uVar8) % 0xc;
        }
        uVar8 = local_8c - (uint)((int)uVar8 < 2);
        iVar4 = 0;
        if (local_90 == -1) {
          local_90 = iVar4;
        }
        *output = (((long)hournum +
                   ((long)local_80 + (long)(local_8c + -0x7b2) * 0x16d +
                    (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar9 * 4) +
                   (long)(int)(uVar8 / 400 + ((uVar8 >> 2) - uVar8 / 100) + -0x1dd)) * 0x18) * 0x3c
                  + (long)minnum) * 0x3c + (long)local_90 + (long)local_88 + -0x15180;
      }
      return iVar4;
    }
    lVar12 = 0;
    while (bVar3 != 0) {
      iVar4 = Curl_isalnum((uint)bVar3);
      if (iVar4 != 0) {
        uVar9 = (uint)pbVar10[lVar12];
        goto LAB_0012c3b5;
      }
      lVar15 = lVar12 + 1;
      lVar12 = lVar12 + 1;
      bVar3 = pbVar10[lVar15];
    }
    uVar9 = 0;
LAB_0012c3b5:
    iVar4 = Curl_isalpha(uVar9);
    pbVar11 = pbVar10 + lVar12;
    if (iVar4 == 0) {
      iVar4 = Curl_isdigit((uint)*pbVar11);
      if (iVar4 != 0) {
        len = 0;
        if (local_88 == -1) {
          iVar4 = __isoc99_sscanf(pbVar11,"%02d:%02d:%02d%n",&hournum,&minnum,&local_88,&len);
          if (iVar4 == 3) {
            pbVar11 = pbVar10 + len + lVar12;
          }
          else {
            if ((local_88 != -1) ||
               (iVar4 = __isoc99_sscanf(pbVar11,"%02d:%02d%n",&hournum,&minnum,&len), iVar4 != 2))
            goto LAB_0012c41b;
            pbVar11 = pbVar10 + len + lVar12;
            local_88 = 0;
          }
        }
        else {
LAB_0012c41b:
          piVar7 = __errno_location();
          local_70 = *piVar7;
          *piVar7 = 0;
          lVar15 = strtol((char *)pbVar11,(char **)buf,10);
          iVar4 = *piVar7;
          if (iVar4 != local_70) {
            *piVar7 = local_70;
          }
          if (iVar4 != 0) {
            return -1;
          }
          if (lVar15 - 0x80000000U < 0xffffffff00000000) {
            return -1;
          }
          iVar4 = curlx_sltosi(lVar15);
          lVar15 = (buf._0_8_ - (long)pbVar10) - lVar12;
          if (local_90 == -1) {
            bVar1 = false;
            if ((date < pbVar11) && ((buf._0_8_ - (long)pbVar10) + -4 == lVar12)) {
              local_90 = -1;
              if (iVar4 < 0x579) {
                bVar3 = pbVar10[lVar12 + -1];
                if ((bVar3 != 0x2d) && (bVar3 != 0x2b)) {
                  lVar15 = 4;
                  goto LAB_0012c66a;
                }
                iVar5 = (iVar4 / 100) * 0x3c + iVar4 % 100;
                local_90 = iVar5 * -0x3c;
                if (bVar3 != 0x2b) {
                  local_90 = iVar5 * 0x3c;
                }
                bVar1 = true;
                lVar15 = 4;
              }
            }
            else {
LAB_0012c66a:
              bVar1 = false;
              local_90 = -1;
            }
          }
          else {
            bVar1 = false;
          }
          if ((((lVar15 == 8) && (local_8c == -1)) && (uVar8 == 0xffffffff)) && (local_80 == -1)) {
            local_8c = iVar4 / 10000;
            uVar8 = (uint)(short)((short)((long)iVar4 % 10000) / 100 + -1);
            local_80 = iVar4 % 100;
            bVar1 = true;
          }
          bVar2 = (bool)(local_80 == -1 & local_84 == 0 & ~bVar1);
          bVar16 = iVar4 - 1U < 0x1f;
          iVar5 = -1;
          if (bVar16) {
            iVar5 = iVar4;
          }
          bVar16 = (bool)(bVar16 & bVar2);
          if (bVar2) {
            local_84 = 1;
            local_80 = iVar5;
          }
          pbVar11 = (byte *)buf._0_8_;
          if (((bVar16 || bVar1) || (local_84 != 1)) || (local_8c != -1)) {
            if (!bVar16 && !bVar1) {
              return -1;
            }
          }
          else {
            if (iVar4 < 100) {
              if (iVar4 < 0x47) {
                iVar4 = iVar4 + 2000;
              }
              else {
                iVar4 = iVar4 + 0x76c;
              }
            }
            local_84 = (uint)(local_80 != -1);
            local_8c = iVar4;
          }
        }
      }
    }
    else {
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      iVar4 = __isoc99_sscanf(pbVar11,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              buf);
      if (iVar4 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(buf);
      }
      if ((int)lVar13 == -1) {
        ppcVar14 = Curl_wkday;
        if (3 < sVar6) {
          ppcVar14 = weekday;
        }
        for (lVar13 = 0; (int)lVar13 != 7; lVar13 = lVar13 + 1) {
          iVar4 = Curl_strcasecompare(buf,ppcVar14[lVar13]);
          if (iVar4 != 0) goto LAB_0012c5a4;
        }
        lVar13 = 0xffffffff;
      }
      if (uVar8 == 0xffffffff) {
        ppcVar14 = Curl_month;
        for (uVar8 = 0; uVar8 != 0xc; uVar8 = uVar8 + 1) {
          iVar4 = Curl_strcasecompare(buf,*ppcVar14);
          if (iVar4 != 0) goto LAB_0012c5a4;
          ppcVar14 = ppcVar14 + 1;
        }
        uVar8 = 0xffffffff;
      }
      if (local_90 != -1) {
        return -1;
      }
      lVar15 = 0;
      while( true ) {
        if ((int)lVar15 == 0x33c) {
          return -1;
        }
        iVar4 = Curl_strcasecompare(buf,tz[0].name + lVar15);
        if (iVar4 != 0) break;
        lVar15 = lVar15 + 0xc;
      }
      local_90 = *(int *)(tz[0].name + lVar15 + 8) * 0x3c;
LAB_0012c5a4:
      pbVar11 = pbVar10 + lVar12 + sVar6;
    }
    local_6c = local_6c + 1;
    pbVar10 = pbVar11;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  struct my_tm tm;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  tm.tm_sec = secnum;
  tm.tm_min = minnum;
  tm.tm_hour = hournum;
  tm.tm_mday = mdaynum;
  tm.tm_mon = monnum;
  tm.tm_year = yearnum;

  /* my_timegm() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  my_timegm(&tm, &t);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}